

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O1

void __thiscall OpenMD::NPrT::evolveEtaB(NPrT *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Mat3x3d *pMVar6;
  uint i;
  long lVar7;
  uint j;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Mat3x3d hmat;
  Mat3x3d local_50;
  
  Snapshot::getHmat(&local_50,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap
                   );
  uVar3 = (ulong)this->axis_;
  uVar5 = (ulong)this->axis1_;
  dVar10 = *(double *)
            ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
            uVar3 * 0x20);
  dVar9 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           uVar5 * 0x20);
  uVar4 = (ulong)this->axis2_;
  dVar11 = *(double *)
            ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
            uVar4 * 0x20);
  pMVar6 = &this->prevEta_;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      (pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar8] =
           pMVar6[-2].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar8]
      ;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar7 = lVar7 + 1;
    pMVar6 = (Mat3x3d *)
             ((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar7 != 3);
  dVar10 = -dVar10;
  dVar12 = (this->super_NPT).targetPressure / 163882576.0;
  dVar1 = *(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar4 * 0x20);
  dVar2 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar9 = dVar9 * dVar11 * dVar2;
  dVar11 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar5 * 0x20) =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar5 * 0x20) -
       (((*(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar5 * 0x20) - dVar12) * dVar10 -
        this->surfaceTension_) * dVar9) / dVar11;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar4 * 0x20) =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar4 * 0x20) - (((dVar1 - dVar12) * dVar10 - this->surfaceTension_) * dVar9) / dVar11;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar3 * 0x20) =
       ((*(double *)
          ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                 super_RectMatrix<double,_3U,_3U>.data_ + uVar3 * 0x20) - dVar12) *
       dVar2 * (this->super_NPT).instaVol) / dVar11 +
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar3 * 0x20);
  return;
}

Assistant:

void NPrT::evolveEtaB() {
    Mat3x3d hmat        = snap->getHmat();
    RealType hz         = hmat(axis_, axis_);
    RealType Axy        = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);
    prevEta_            = eta;
    RealType sx         = -hz * (press(axis1_, axis1_) -
                         targetPressure / Constants::pressureConvert);
    RealType sy         = -hz * (press(axis2_, axis2_) -
                         targetPressure / Constants::pressureConvert);
    eta(axis1_, axis1_) = oldEta_(axis1_, axis1_) -
                          dt2 * Axy * (sx - surfaceTension_) / (NkBT * tb2);
    eta(axis2_, axis2_) = oldEta_(axis2_, axis2_) -
                          dt2 * Axy * (sy - surfaceTension_) / (NkBT * tb2);
    eta(axis_, axis_) = oldEta_(axis_, axis_) +
                        dt2 * instaVol *
                            (press(axis_, axis_) -
                             targetPressure / Constants::pressureConvert) /
                            (NkBT * tb2);
  }